

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_server.hpp
# Opt level: O0

void __thiscall cinatra::coro_http_server::stop(coro_http_server *this)

{
  bool bVar1;
  element_type *this_00;
  unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
  *in_RDI;
  pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_> *conn;
  iterator __end2;
  iterator __begin2;
  unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
  *__range2;
  scoped_lock<std::mutex> lock;
  error_code ec;
  io_context_pool *in_stack_ffffffffffffffb0;
  error_code *in_stack_ffffffffffffffb8;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false>
  local_30;
  __node_base_ptr *local_28;
  
  if (((in_RDI->_M_h)._M_bucket_count != 0) ||
     (bVar1 = std::thread::joinable((thread *)in_stack_ffffffffffffffb0), bVar1)) {
    std::atomic<bool>::operator=
              ((atomic<bool> *)in_stack_ffffffffffffffb0,SUB81((ulong)in_RDI >> 0x38,0));
    std::error_code::error_code((error_code *)in_stack_ffffffffffffffb0);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::cancel(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    close_acceptor((coro_http_server *)
                   __end2.
                   super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false>
                   ._M_cur);
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffffb0,(mutex_type *)in_RDI);
    local_28 = &in_RDI[3]._M_h._M_single_bucket;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
         ::begin(in_RDI);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
         ::end(in_RDI);
    while (bVar1 = std::__detail::operator==(&local_30,&local_38), ((bVar1 ^ 0xffU) & 1) != 0) {
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false,_false>
      ::operator*((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false,_false>
                   *)0x1aee82);
      this_00 = std::
                __shared_ptr_access<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<cinatra::coro_http_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1aee95);
      coro_http_connection::close(this_00,0);
      std::__detail::
      _Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false,_false>
      ::operator++((_Node_iterator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>,_false,_false>
                    *)in_stack_ffffffffffffffb0);
    }
    std::
    unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
    ::clear((unordered_map<unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cinatra::coro_http_connection>_>_>_>
             *)0x1aeedc);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x1aeee6);
    if ((in_RDI->_M_h)._M_bucket_count == 0) {
      null_logger_t::operator<<
                ((null_logger_t *)&NULL_LOGGER,
                 (char (*) [47])"wait for server\'s thread-pool finish all work.");
      std::unique_ptr<coro_io::io_context_pool,_std::default_delete<coro_io::io_context_pool>_>::
      operator->((unique_ptr<coro_io::io_context_pool,_std::default_delete<coro_io::io_context_pool>_>
                  *)0x1aef0d);
      coro_io::io_context_pool::stop(in_stack_ffffffffffffffb0);
      null_logger_t::operator<<
                ((null_logger_t *)&NULL_LOGGER,(char (*) [31])"server\'s thread-pool finished.");
      std::thread::join();
      null_logger_t::operator<<
                ((null_logger_t *)&NULL_LOGGER,(char (*) [25])"stop coro_http_server ok");
    }
    else {
      (in_RDI->_M_h)._M_bucket_count = 0;
    }
  }
  return;
}

Assistant:

void stop() {
    if (out_ctx_ == nullptr && !thd_.joinable()) {
      return;
    }

    stop_timer_ = true;
    std::error_code ec;
    check_timer_.cancel(ec);

    close_acceptor();

    // close current connections.
    {
      std::scoped_lock lock(conn_mtx_);
      for (auto &conn : connections_) {
        conn.second->close(false);
      }
      connections_.clear();
    }

    if (out_ctx_ == nullptr) {
      CINATRA_LOG_INFO << "wait for server's thread-pool finish all work.";
      pool_->stop();

      CINATRA_LOG_INFO << "server's thread-pool finished.";
      thd_.join();
      CINATRA_LOG_INFO << "stop coro_http_server ok";
    }
    else {
      out_ctx_ = nullptr;
    }
  }